

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::render::button(cvui_block_t *theBlock,int theState,Rect *theShape,String *theLabel)

{
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  undefined4 local_70 [2];
  cvui_block_t *local_68;
  undefined8 local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_60 = 0;
  local_70[0] = 0x3010000;
  local_48._0_4_ = theShape->x;
  local_48._4_4_ = theShape->y;
  uStack_40._0_4_ = theShape->width;
  uStack_40._4_4_ = theShape->height;
  local_a8 = 0x4044800000000000;
  uStack_a0 = 0x4044800000000000;
  local_98 = 0x4044800000000000;
  uStack_90 = 0;
  local_68 = theBlock;
  cv::rectangle(local_70,&local_48,&local_a8,1,8,0);
  local_58 = theShape->x + 1;
  iStack_54 = theShape->y + 1;
  iStack_50 = theShape->width + -2;
  iStack_4c = theShape->height + -2;
  theShape->x = local_58;
  theShape->y = iStack_54;
  theShape->width = iStack_50;
  theShape->height = iStack_4c;
  local_60 = 0;
  local_70[0] = 0x3010000;
  local_a8 = 0x4052800000000000;
  uStack_a0 = 0x4052800000000000;
  local_98 = 0x4052800000000000;
  uStack_90 = 0;
  local_68 = theBlock;
  cv::rectangle(local_70,&local_58,&local_a8,1,8,0);
  local_88 = theShape->x + 1;
  iStack_84 = theShape->y + 1;
  iStack_80 = theShape->width + -2;
  iStack_7c = theShape->height + -2;
  theShape->x = local_88;
  theShape->y = iStack_84;
  theShape->width = iStack_80;
  theShape->height = iStack_7c;
  local_60 = 0;
  local_70[0] = 0x3010000;
  if (theState == 4) {
    local_a8 = 0x4054800000000000;
    uStack_a0 = 0x4054800000000000;
  }
  else if (theState == 5) {
    local_a8 = 0x4050800000000000;
    uStack_a0 = 0x4050800000000000;
  }
  else {
    local_a8 = 0x4049000000000000;
    uStack_a0 = 0x4049000000000000;
  }
  uStack_90 = 0;
  local_98 = uStack_a0;
  local_68 = theBlock;
  cv::rectangle(local_70,&local_88,&local_a8,0xffffffff,8,0);
  return;
}

Assistant:

void button(cvui_block_t& theBlock, int theState, cv::Rect& theShape, const cv::String& theLabel) {
		// Outline
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x29, 0x29, 0x29));

		// Border
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Inside
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, theState == OUT ? cv::Scalar(0x42, 0x42, 0x42) : (theState == OVER ? cv::Scalar(0x52, 0x52, 0x52) : cv::Scalar(0x32, 0x32, 0x32)), CVUI_FILLED);
	}